

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O2

void mutex_cond_unexpired_deadline_ping_pong(ping_pong *pp,int parity)

{
  pthread_mutex_t *__mutex;
  uint uVar1;
  timespec ts;
  
  clock_gettime(0,(timespec *)&ts);
  ts.tv_sec = ts.tv_sec + 0xe10;
  __mutex = &pp->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  while (uVar1 = pp->i, (int)uVar1 < pp->limit) {
    while ((uVar1 & 1) == parity) {
      pthread_cond_timedwait
                ((pthread_cond_t *)(pp->cond + (uint)parity),(pthread_mutex_t *)__mutex,
                 (timespec *)&ts);
      uVar1 = pp->i;
    }
    pp->i = uVar1 + 1;
    pthread_cond_signal((pthread_cond_t *)(pp->cond + (1 - parity)));
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  ping_pong_done(pp);
  return;
}

Assistant:

static void mutex_cond_unexpired_deadline_ping_pong (ping_pong *pp, int parity) {
	struct timespec ts;
	clock_gettime (CLOCK_REALTIME, &ts);
	ts.tv_sec += 3600;
	pthread_mutex_lock (&pp->mutex);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			pthread_cond_timedwait (&pp->cond[parity], &pp->mutex, &ts);
		}
		pp->i++;
		pthread_cond_signal (&pp->cond[1-parity]);
	}
	pthread_mutex_unlock (&pp->mutex);
	ping_pong_done (pp);
}